

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  mjs::platform_init();
  tested_version_ = es5;
  test_main();
  tested_version_ = es1;
  test_main();
  tested_version_ = es3;
  test_main();
  return 0;
}

Assistant:

int main() {
    platform_init();
    try {
        // Start by testing latest version
        tested_version_ = version::latest;
        test_main();
        for (const auto ver: supported_versions) {
            if (ver == version::latest) {
                // no need to recheck
                continue;
            }
            tested_version_ = ver;
            test_main();
        }
    } catch (const std::exception& e) {
        std::wcerr << e.what() << "\n";
        std::wcerr << "Tested version: " << tested_version() << "\n";
        return 1;
    }
    return 0;
}